

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int encode_frame(LINK_ENDPOINT_HANDLE link_endpoint,AMQP_VALUE performative,PAYLOAD *payloads,
                size_t payload_count)

{
  int iVar1;
  SESSION_INSTANCE *session_instance;
  LINK_ENDPOINT_INSTANCE *link_endpoint_instance;
  int result;
  size_t payload_count_local;
  PAYLOAD *payloads_local;
  AMQP_VALUE performative_local;
  LINK_ENDPOINT_HANDLE link_endpoint_local;
  
  if ((link_endpoint == (LINK_ENDPOINT_HANDLE)0x0) || (performative == (AMQP_VALUE)0x0)) {
    link_endpoint_instance._4_4_ = 0x4dd;
  }
  else {
    iVar1 = connection_encode_frame
                      (link_endpoint->session->endpoint,performative,payloads,payload_count,
                       (ON_SEND_COMPLETE)0x0,(void *)0x0);
    if (iVar1 == 0) {
      link_endpoint_instance._4_4_ = 0;
    }
    else {
      link_endpoint_instance._4_4_ = 0x4e6;
    }
  }
  return link_endpoint_instance._4_4_;
}

Assistant:

static int encode_frame(LINK_ENDPOINT_HANDLE link_endpoint, AMQP_VALUE performative, PAYLOAD* payloads, size_t payload_count)
{
    int result;

    if ((link_endpoint == NULL) ||
        (performative == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        LINK_ENDPOINT_INSTANCE* link_endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)link_endpoint_instance->session;

        if (connection_encode_frame(session_instance->endpoint, performative, payloads, payload_count, NULL, NULL) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }

    return result;
}